

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeSORegRegOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  DecodeStatus DVar4;
  DecodeStatus DVar5;
  
  DVar2 = DecodeGPRnopcRegisterClass(Inst,Val & 0xf,Address,Decoder);
  bVar1 = true;
  if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
    if (DVar2 != MCDisassembler_Fail) {
      DVar2 = MCDisassembler_Success;
    }
    bVar1 = false;
  }
  DVar5 = MCDisassembler_Fail;
  if (bVar1) {
    DVar3 = DecodeGPRnopcRegisterClass(Inst,Val >> 8 & 0xf,Address_00,Decoder);
    if (DVar3 == MCDisassembler_Fail) {
      bVar1 = false;
      DVar4 = DVar3;
    }
    else {
      bVar1 = true;
      DVar4 = DVar2;
      if ((DVar3 != MCDisassembler_Success) && (DVar4 = DVar3, DVar3 != MCDisassembler_SoftFail)) {
        bVar1 = false;
        DVar4 = DVar2;
      }
    }
    if (bVar1) {
      MCOperand_CreateImm0(Inst,*(int64_t *)(&DAT_003751b0 + (ulong)(Val >> 5 & 3) * 8));
      DVar5 = DVar4;
    }
  }
  return DVar5;
}

Assistant:

static DecodeStatus DecodeSORegRegOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc Shift;

	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned Rs = fieldFromInstruction_4(Val, 8, 4);

	// Register-register
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rs, Address, Decoder)))
		return MCDisassembler_Fail;

	Shift = ARM_AM_lsl;
	switch (type) {
		case 0:
			Shift = ARM_AM_lsl;
			break;
		case 1:
			Shift = ARM_AM_lsr;
			break;
		case 2:
			Shift = ARM_AM_asr;
			break;
		case 3:
			Shift = ARM_AM_ror;
			break;
	}

	MCOperand_CreateImm0(Inst, Shift);

	return S;
}